

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesIterator.h
# Opt level: O0

void __thiscall
Rml::PropertiesIterator::PropertiesIterator
          (PropertiesIterator *this,PropertyIt it_style,PropertyIt it_style_end,
          PropertyIt it_definition,PropertyIt it_definition_end)

{
  PropertiesIterator *this_local;
  PropertyIt it_style_end_local;
  PropertyIt it_style_local;
  
  PropertyIdSet::PropertyIdSet(&this->iterated_properties);
  (this->it_style).mKeyVals = it_style.mKeyVals;
  (this->it_style).mInfo = it_style.mInfo;
  (this->it_style_end).mKeyVals = it_style_end.mKeyVals;
  (this->it_style_end).mInfo = it_style_end.mInfo;
  (this->it_definition).mKeyVals = it_definition.mKeyVals;
  (this->it_definition).mInfo = it_definition.mInfo;
  (this->it_definition_end).mKeyVals = it_definition_end.mKeyVals;
  (this->it_definition_end).mInfo = it_definition_end.mInfo;
  this->at_end = false;
  ProceedToNextValid(this);
  return;
}

Assistant:

PropertiesIterator(PropertyIt it_style, PropertyIt it_style_end, PropertyIt it_definition, PropertyIt it_definition_end) :
		it_style(it_style), it_style_end(it_style_end), it_definition(it_definition), it_definition_end(it_definition_end)
	{
		ProceedToNextValid();
	}